

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_catalog_entry.cpp
# Opt level: O3

string * __thiscall
duckdb::SequenceCatalogEntry::ToSQL_abi_cxx11_
          (string *__return_storage_ptr__,SequenceCatalogEntry *this)

{
  char *pcVar1;
  SequenceData seq_data;
  stringstream ss;
  SequenceData local_1e0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  GetData(&local_1e0,this);
  ::std::__cxx11::stringstream::stringstream(local_1a0);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,"CREATE SEQUENCE ",0x10);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,
             (this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name._M_dataplus.
             _M_p,(this->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.name.
                  _M_string_length);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," INCREMENT BY ",0xe);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," MINVALUE ",10);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," MAXVALUE ",10);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," START ",7);
  ::std::ostream::_M_insert<long>((long)local_190);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190," ",1);
  pcVar1 = "NO CYCLE";
  if ((ulong)local_1e0.cycle != 0) {
    pcVar1 = "CYCLE";
  }
  ::std::__ostream_insert<char,std::char_traits<char>>
            (local_190,pcVar1,((ulong)local_1e0.cycle ^ 1) * 3 + 5);
  ::std::__ostream_insert<char,std::char_traits<char>>(local_190,";",1);
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a0);
  ::std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

string SequenceCatalogEntry::ToSQL() const {
	auto seq_data = GetData();

	std::stringstream ss;
	ss << "CREATE SEQUENCE ";
	ss << name;
	ss << " INCREMENT BY " << seq_data.increment;
	ss << " MINVALUE " << seq_data.min_value;
	ss << " MAXVALUE " << seq_data.max_value;
	ss << " START " << seq_data.counter;
	ss << " " << (seq_data.cycle ? "CYCLE" : "NO CYCLE") << ";";
	return ss.str();
}